

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdNonDsdSizeMax(Kit_DsdNtk_t *pNtk)

{
  bool bVar1;
  uint local_20;
  uint local_1c;
  uint nSizeMax;
  uint i;
  Kit_DsdObj_t *pObj;
  Kit_DsdNtk_t *pNtk_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    bVar1 = false;
    if (local_1c < pNtk->nNodes) {
      _nSizeMax = pNtk->pNodes[local_1c];
      bVar1 = _nSizeMax != (Kit_DsdObj_t *)0x0;
    }
    if (!bVar1) break;
    if ((((uint)*_nSizeMax >> 6 & 7) == 5) && (local_20 < (uint)*_nSizeMax >> 0x1a)) {
      local_20 = (uint)*_nSizeMax >> 0x1a;
    }
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Kit_DsdNonDsdSizeMax( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    unsigned i, nSizeMax = 0;
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        if ( nSizeMax < pObj->nFans )
            nSizeMax = pObj->nFans;
    }
    return nSizeMax;
}